

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O0

Solution * ConstructionHeuristics::randomIteration(Solution *solution)

{
  Turn *this;
  default_random_engine this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int __n;
  ulong uVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar5;
  size_type sVar6;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *this_01;
  reference __x;
  reference ppTVar7;
  Scenario *this_02;
  WeekData *this_03;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>_>
  *this_04;
  string *psVar8;
  mapped_type *this_05;
  ShiftType *this_06;
  mapped_type *this_07;
  const_reference ppDVar9;
  pointer ppVar10;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
  local_c0;
  const_iterator iter;
  int local_b0;
  int i;
  int loop;
  int requiredNurses;
  Turn *turn;
  iterator __end2;
  iterator __begin2;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2;
  vector<Turn_*,_std::allocator<Turn_*>_> day;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *__range1;
  type random;
  uniform_int_distribution<int> distribution;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_20;
  default_random_engine generator;
  Solution *solution_local;
  
  generator._M_x = (unsigned_long)solution;
  distribution._M_param = (param_type)std::chrono::_V2::system_clock::now();
  local_28.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&distribution);
  uVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_28);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_20,uVar4 & 0xffffffff);
  pmVar5 = Solution::getNurses_abi_cxx11_((Solution *)generator._M_x);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
          ::size(pmVar5);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&random._M_bound_args,0,(int)sVar6 + -1);
  std::
  bind<std::uniform_int_distribution<int>&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            ((uniform_int_distribution<int> *)&__range1,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &random._M_bound_args);
  this_01 = Solution::getTurns((Solution *)generator._M_x);
  __end1 = std::
           vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           ::begin(this_01);
  day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                ::end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
                                *)&day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      return (Solution *)generator._M_x;
    }
    __x = __gnu_cxx::
          __normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
          ::operator*(&__end1);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2,__x);
    __end2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::begin
                       ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    turn = (Turn *)std::vector<Turn_*,_std::allocator<Turn_*>_>::end
                             ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                                       *)&turn), bVar1) {
      ppTVar7 = __gnu_cxx::__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                ::operator*(&__end2);
      this = *ppTVar7;
      this_02 = Scenario::getInstance();
      this_03 = Scenario::getWeekData(this_02);
      this_04 = WeekData::getRequirements_abi_cxx11_(this_03);
      psVar8 = Turn::getSkill_abi_cxx11_(this);
      this_05 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>_>
                ::at(this_04,psVar8);
      this_06 = Turn::getShiftType(this);
      psVar8 = ShiftType::getId_abi_cxx11_(this_06);
      this_07 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
                ::at(this_05,psVar8);
      uVar2 = Turn::getDay(this);
      ppDVar9 = std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>::at
                          (this_07,(ulong)uVar2);
      iVar3 = DayRequirement::getMinimumCoverage(*ppDVar9);
      local_b0 = 0;
      for (iter._M_node._4_4_ = 0; iter._M_node._4_4_ < iVar3;
          iter._M_node._4_4_ = iter._M_node._4_4_ + 1) {
        local_b0 = local_b0 + 1;
        pmVar5 = Solution::getNurses_abi_cxx11_((Solution *)generator._M_x);
        local_c0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
             ::begin(pmVar5);
        __n = std::
              _Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
              ::operator()((_Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
                            *)&__range1);
        std::
        advance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,NurseSolution*>>,int>
                  (&local_c0,__n);
        this_00 = generator;
        ppVar10 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
                  ::operator->(&local_c0);
        bVar1 = Solution::assignNurseToTurn((Solution *)this_00._M_x,ppVar10->second,this);
        if (!bVar1) {
          iter._M_node._4_4_ = iter._M_node._4_4_ + -1;
        }
        pmVar5 = Solution::getNurses_abi_cxx11_((Solution *)generator._M_x);
        sVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
                ::size(pmVar5);
        if (sVar6 * 2 < (ulong)(long)local_b0) {
          solution_local = (Solution *)0x0;
          bVar1 = true;
          goto LAB_0013e1c8;
        }
      }
      __gnu_cxx::__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
      operator++(&__end2);
    }
    bVar1 = false;
LAB_0013e1c8:
    std::vector<Turn_*,_std::allocator<Turn_*>_>::~vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    if (bVar1) {
      return solution_local;
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

Solution* ConstructionHeuristics::randomIteration(Solution * solution) {
    default_random_engine generator((unsigned int) chrono::system_clock::now().time_since_epoch().count());
    uniform_int_distribution<int> distribution(0, (int) solution->getNurses().size()-1);

    auto random = bind(distribution, generator);

    for (vector<Turn *> day : solution->getTurns())
        for (Turn *turn : day) {
            int requiredNurses = Scenario::getInstance()->getWeekData().getRequirements().at(turn->getSkill()).at(turn->getShiftType()->getId()).at((unsigned int)turn->getDay())->getMinimumCoverage();
            int loop = 0;
            for(int i = 0; i < requiredNurses;i++)
            {
                loop++;
                auto iter = solution->getNurses().begin();
                std::advance( iter, random() );
                if(!solution->assignNurseToTurn(iter->second, turn))
                    i--;
                if(loop > solution->getNurses().size()*2)
                    return nullptr;
            }
        }
    return solution;
}